

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

iteration_time __thiscall
helics::Federate::requestTimeIterative
          (Federate *this,Time nextInternalTimeStep,IterationRequest iterate)

{
  element_type *peVar1;
  undefined4 extraout_var;
  InvalidFunctionCall *this_00;
  uint extraout_EDX;
  Time newTime;
  undefined8 unaff_RBP;
  uint7 uVar3;
  ulong uVar2;
  string_view message;
  iteration_time iVar4;
  
  if ((this->currentMode)._M_i == EXECUTING) {
    if ((this->timeRequestEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::
      function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
      ::operator()(&this->timeRequestEntryCallback,
                   (TimeRepresentation<count_time<9,_long>_>)(this->mCurrentTime).internalTimeCode,
                   (TimeRepresentation<count_time<9,_long>_>)nextInternalTimeStep.internalTimeCode,
                   iterate != NO_ITERATIONS);
    }
    peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    newTime.internalTimeCode._0_4_ =
         (*peVar1->_vptr_Core[0x1b])
                   (peVar1,(ulong)(uint)(this->fedID).fid,nextInternalTimeStep.internalTimeCode,
                    (ulong)(uint)(int)(char)iterate);
    newTime.internalTimeCode._4_4_ = extraout_var;
    uVar2 = (ulong)extraout_EDX;
    if ((byte)extraout_EDX < 8) {
      uVar3 = (uint7)(uint3)(extraout_EDX >> 8);
      switch(uVar2 & 0xff) {
      case 0:
        uVar2 = 0;
        postTimeRequestOperations(this,newTime,false);
        break;
      case 2:
        postTimeRequestOperations(this,newTime,true);
        uVar2 = CONCAT71(uVar3,2);
        break;
      case 3:
        updateFederateMode(this,FINISHED);
        updateSimulationTime(this,newTime,(Time)(this->mCurrentTime).internalTimeCode,false);
        uVar2 = CONCAT71(uVar3,3);
        break;
      case 7:
        updateFederateMode(this,ERROR_STATE);
        uVar2 = CONCAT71(uVar3,7);
      }
    }
  }
  else {
    newTime.internalTimeCode = 0x7fffffffffffffff;
    uVar2 = CONCAT71((int7)((ulong)unaff_RBP >> 8),3);
    if (((this->currentMode)._M_i != FINALIZE) && ((this->currentMode)._M_i != FINISHED)) {
      this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      message._M_str = "cannot call request time in present state";
      message._M_len = 0x29;
      InvalidFunctionCall::InvalidFunctionCall(this_00,message);
      __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
    }
  }
  iVar4._8_8_ = uVar2 & 0xffffffff;
  iVar4.grantedTime.internalTimeCode = newTime.internalTimeCode;
  return iVar4;
}

Assistant:

iteration_time Federate::requestTimeIterative(Time nextInternalTimeStep, IterationRequest iterate)
{
    if (currentMode == Modes::EXECUTING) {
        preTimeRequestOperations(nextInternalTimeStep, iterate != IterationRequest::NO_ITERATIONS);
        auto iterativeTime = coreObject->requestTimeIterative(fedID, nextInternalTimeStep, iterate);
        switch (iterativeTime.state) {
            case IterationResult::NEXT_STEP:
                postTimeRequestOperations(iterativeTime.grantedTime, false);
                break;
            case IterationResult::ITERATING:
                postTimeRequestOperations(iterativeTime.grantedTime, true);
                break;
            case IterationResult::HALTED:
                updateFederateMode(Modes::FINISHED);
                updateSimulationTime(iterativeTime.grantedTime, mCurrentTime, false);
                break;
            case IterationResult::ERROR_RESULT:
                // LCOV_EXCL_START
                updateFederateMode(Modes::ERROR_STATE);
                break;
                // LCOV_EXCL_STOP
        }
        return iterativeTime;
    }
    if (currentMode == Modes::FINALIZE || currentMode == Modes::FINISHED) {
        return {Time::maxVal(), IterationResult::HALTED};
    }
    throw(InvalidFunctionCall("cannot call request time in present state"));
}